

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_zstd.c
# Opt level: O3

int archive_write_add_filter_zstd(archive *_a)

{
  int iVar1;
  archive_write_filter *paVar2;
  undefined4 *__ptr;
  ZSTD_CStream *pZVar3;
  char *fmt;
  
  paVar2 = __archive_write_allocate_filter(_a);
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_add_filter_zstd");
  if (iVar1 != -0x1e) {
    __ptr = (undefined4 *)calloc(1,0x68);
    if (__ptr == (undefined4 *)0x0) {
      fmt = "Out of memory";
    }
    else {
      paVar2->data = __ptr;
      paVar2->open = archive_compressor_zstd_open;
      paVar2->options = archive_compressor_zstd_options;
      paVar2->flush = archive_compressor_zstd_flush;
      paVar2->close = archive_compressor_zstd_close;
      paVar2->free = archive_compressor_zstd_free;
      paVar2->code = 0xe;
      paVar2->name = "zstd";
      *__ptr = 3;
      *(undefined8 *)(__ptr + 8) = 0xffffffffffffffff;
      pZVar3 = ZSTD_createCStream();
      *(ZSTD_CStream **)(__ptr + 0x12) = pZVar3;
      if (pZVar3 != (ZSTD_CStream *)0x0) {
        return 0;
      }
      free(__ptr);
      fmt = "Failed to allocate zstd compressor object";
    }
    archive_set_error(_a,0xc,fmt);
  }
  return -0x1e;
}

Assistant:

int
archive_write_add_filter_zstd(struct archive *_a)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct archive_write_filter *f = __archive_write_allocate_filter(_a);
	struct private_data *data;
	archive_check_magic(&a->archive, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_add_filter_zstd");

	data = calloc(1, sizeof(*data));
	if (data == NULL) {
		archive_set_error(&a->archive, ENOMEM, "Out of memory");
		return (ARCHIVE_FATAL);
	}
	f->data = data;
	f->open = &archive_compressor_zstd_open;
	f->options = &archive_compressor_zstd_options;
	f->flush = &archive_compressor_zstd_flush;
	f->close = &archive_compressor_zstd_close;
	f->free = &archive_compressor_zstd_free;
	f->code = ARCHIVE_FILTER_ZSTD;
	f->name = "zstd";
	data->compression_level = CLEVEL_DEFAULT;
	data->threads = 0;
	data->long_distance = 0;
#if HAVE_ZSTD_H && HAVE_LIBZSTD_COMPRESSOR
	data->frame_per_file = 0;
	data->min_frame_size = 0;
	data->max_frame_size = SIZE_MAX;
	data->cur_frame_in = 0;
	data->cur_frame_out = 0;
	data->cstream = ZSTD_createCStream();
	if (data->cstream == NULL) {
		free(data);
		archive_set_error(&a->archive, ENOMEM,
		    "Failed to allocate zstd compressor object");
		return (ARCHIVE_FATAL);
	}

	return (ARCHIVE_OK);
#else
	data->pdata = __archive_write_program_allocate("zstd");
	if (data->pdata == NULL) {
		free(data);
		archive_set_error(&a->archive, ENOMEM, "Out of memory");
		return (ARCHIVE_FATAL);
	}
	archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
	    "Using external zstd program");
	return (ARCHIVE_WARN);
#endif
}